

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batch_helper.cxx
# Opt level: O2

void __thiscall
batch_helper::make_target_name(batch_helper *this,string *target,char *source,char *extension)

{
  string name;
  string folder;
  string local_60;
  string local_40;
  
  if ((this->m_output_file)._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)target);
    return;
  }
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  xray_re::xr_file_system::split_path(source,&local_40,&local_60,(string *)0x0);
  std::__cxx11::string::_M_assign((string *)target);
  std::__cxx11::string::append((string *)target);
  std::__cxx11::string::append((char *)target);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void batch_helper::make_target_name(std::string& target, const char* source, const char* extension) const
{
	if (m_output_file.empty()) {
		std::string name, folder;
		xr_file_system::split_path(source, &folder, &name);
		target = m_output_folder.empty() ? folder : m_output_folder;
		target += name;
		target += extension;
	} else {
		target = m_output_file;
	}
}